

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<256U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::gcd<256u,unsigned_int,void,false>
          (uintwide_t<256U,_unsigned_int,_void,_false> *__return_storage_ptr__,wide_integer *this,
          uintwide_t<256U,_unsigned_int,_void,_false> *a,
          uintwide_t<256U,_unsigned_int,_void,_false> *b)

{
  value_type_conflict *pvVar1;
  value_type_conflict *pvVar2;
  uint uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  enable_if_t<std::is_integral<unsigned_long>::value,_bool> eVar14;
  unsigned_long vr;
  unsigned_fast_type uVar15;
  unsigned_fast_type n;
  uint uVar16;
  long lVar17;
  value_type_conflict *pvVar18;
  ulong uVar19;
  long lVar20;
  value_type_conflict *pvVar21;
  byte bVar22;
  bool bVar23;
  local_wide_integer_type v;
  local_wide_integer_type u;
  uintwide_t<256U,_unsigned_int,_void,_false> local_c8;
  uintwide_t<256U,_unsigned_int,_void,_false> local_a8;
  uintwide_t<256U,_unsigned_int,_void,_false> local_88;
  value_type_conflict local_68 [2];
  unsigned_fast_type local_60;
  
  uVar4 = *(unsigned_long *)this;
  local_88.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_88.values.super_array<unsigned_int,_8UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_88.values.super_array<unsigned_int,_8UL>.elems[0] = (int)uVar4;
  local_88.values.super_array<unsigned_int,_8UL>.elems[1] = (int)(uVar4 >> 0x20);
  uVar7 = local_88.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  local_88.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  uVar5 = *(unsigned_long *)(a->values).super_array<unsigned_int,_8UL>.elems;
  local_a8.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_8UL>.elems + 4);
  local_a8.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_8UL>.elems + 6);
  local_a8.values.super_array<unsigned_int,_8UL>.elems[0] = (int)uVar5;
  local_a8.values.super_array<unsigned_int,_8UL>.elems[1] = (int)(uVar5 >> 0x20);
  uVar6 = local_a8.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  local_a8.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_8UL>.elems + 2);
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[4] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[5] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[6] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[7] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[0] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
  (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
  lVar17 = 0x1c;
  do {
    bVar22 = 0;
    if (lVar17 == -4) break;
    uVar16 = *(uint *)((long)local_88.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    uVar3 = *(uint *)((long)local_a8.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    bVar22 = -(uVar16 <= uVar3) | 1;
    lVar17 = lVar17 + -4;
  } while (uVar16 == uVar3);
  if (bVar22 == 0) {
LAB_0013607c:
    local_c8.values.super_array<unsigned_int,_8UL>.elems[0] = *(value_type_conflict *)this;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[1] = *(value_type_conflict *)(this + 4);
    local_c8.values.super_array<unsigned_int,_8UL>.elems[2] = *(value_type_conflict *)(this + 8);
    local_c8.values.super_array<unsigned_int,_8UL>.elems[3] = *(value_type_conflict *)(this + 0xc);
    local_c8.values.super_array<unsigned_int,_8UL>.elems[4] = *(value_type_conflict *)(this + 0x10);
    local_c8.values.super_array<unsigned_int,_8UL>.elems[5] = *(value_type_conflict *)(this + 0x14);
    local_c8.values.super_array<unsigned_int,_8UL>.elems[6] = *(value_type_conflict *)(this + 0x18);
    local_c8.values.super_array<unsigned_int,_8UL>.elems[7] = *(value_type_conflict *)(this + 0x1c);
LAB_0013629f:
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[4] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[4];
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[5] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[5];
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[6] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[6];
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[7] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[7];
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[0] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[0];
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[1] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[1];
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[2] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[2];
    (__return_storage_ptr__->values).super_array<unsigned_int,_8UL>.elems[3] =
         local_c8.values.super_array<unsigned_int,_8UL>.elems[3];
    return __return_storage_ptr__;
  }
  local_a8.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar5;
  if (local_a8.values.super_array<unsigned_int,_8UL>.elems[0] == 0) {
    local_c8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    lVar17 = 0x1c;
    do {
      bVar22 = 0;
      if (lVar17 == -4) break;
      uVar16 = *(uint *)((long)local_a8.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      uVar3 = *(uint *)((long)local_c8.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      bVar22 = -(uVar16 <= uVar3) | 1;
      lVar17 = lVar17 + -4;
    } while (uVar16 == uVar3);
    if (bVar22 == 0) goto LAB_0013607c;
  }
  local_88.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar4;
  if (local_88.values.super_array<unsigned_int,_8UL>.elems[0] == 0) {
    local_c8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
    local_c8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    lVar17 = 0x1c;
    do {
      bVar22 = 0;
      if (lVar17 == -4) break;
      uVar16 = *(uint *)((long)local_88.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      uVar3 = *(uint *)((long)local_c8.values.super_array<unsigned_int,_8UL>.elems + lVar17);
      bVar22 = -(uVar16 <= uVar3) | 1;
      lVar17 = lVar17 + -4;
    } while (uVar16 == uVar3);
    if (bVar22 == 0) {
      local_c8.values.super_array<unsigned_int,_8UL>.elems[0] =
           (a->values).super_array<unsigned_int,_8UL>.elems[0];
      local_c8.values.super_array<unsigned_int,_8UL>.elems[1] =
           (a->values).super_array<unsigned_int,_8UL>.elems[1];
      local_c8.values.super_array<unsigned_int,_8UL>.elems[2] =
           (a->values).super_array<unsigned_int,_8UL>.elems[2];
      local_c8.values.super_array<unsigned_int,_8UL>.elems[3] =
           (a->values).super_array<unsigned_int,_8UL>.elems[3];
      local_c8.values.super_array<unsigned_int,_8UL>.elems[4] =
           (a->values).super_array<unsigned_int,_8UL>.elems[4];
      local_c8.values.super_array<unsigned_int,_8UL>.elems[5] =
           (a->values).super_array<unsigned_int,_8UL>.elems[5];
      local_c8.values.super_array<unsigned_int,_8UL>.elems[6] =
           (a->values).super_array<unsigned_int,_8UL>.elems[6];
      local_c8.values.super_array<unsigned_int,_8UL>.elems[7] =
           (a->values).super_array<unsigned_int,_8UL>.elems[7];
      goto LAB_0013629f;
    }
  }
  local_a8.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar6;
  local_88.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar7;
  uVar15 = lsb<256u,unsigned_int,void,false>(&local_88);
  n = lsb<256u,unsigned_int,void,false>(&local_a8);
  local_60 = uVar15;
  if (n < uVar15) {
    local_60 = n;
  }
  if (uVar15 != 0) {
    if ((uVar15 & 0xffffff00) == 0) {
      uintwide_t<256U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_88,uVar15);
    }
    else {
      local_88.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
      local_88.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
      local_88.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
      local_88.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
      local_88.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
      local_88.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
      local_88.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
      local_88.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    }
  }
  if (n != 0) {
    if ((n & 0xffffff00) == 0) {
      uintwide_t<256U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_a8,n);
    }
    else {
      local_a8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
      local_a8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
      local_a8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
      local_a8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
      local_a8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
      local_a8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
      local_a8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
      local_a8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    }
  }
  pvVar18 = (value_type_conflict *)&local_88;
  pvVar21 = local_68;
LAB_001360cf:
  uVar12 = local_88.values.super_array<unsigned_int,_8UL>.elems._24_8_;
  uVar10 = local_88.values.super_array<unsigned_int,_8UL>.elems._16_8_;
  uVar7 = local_88.values.super_array<unsigned_int,_8UL>.elems._8_8_;
  uVar6 = local_88.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  bVar22 = 0;
  if ((uintwide_t<256U,_unsigned_int,_void,_false> *)pvVar21 != &local_88) goto code_r0x001360d4;
  goto LAB_001360fe;
code_r0x001360d4:
  pvVar1 = pvVar21 + -1;
  pvVar2 = pvVar18 + -1;
  bVar22 = -(*pvVar1 <= *pvVar2) | 1;
  pvVar18 = pvVar18 + -1;
  pvVar21 = pvVar21 + -1;
  if (*pvVar1 == *pvVar2) goto LAB_001360cf;
LAB_001360fe:
  if (bVar22 == 1) {
    local_88.values.super_array<unsigned_int,_8UL>.elems[0] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[0];
    local_88.values.super_array<unsigned_int,_8UL>.elems[1] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[1];
    uVar8 = local_88.values.super_array<unsigned_int,_8UL>.elems._0_8_;
    local_88.values.super_array<unsigned_int,_8UL>.elems[2] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[2];
    local_88.values.super_array<unsigned_int,_8UL>.elems[3] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[3];
    uVar9 = local_88.values.super_array<unsigned_int,_8UL>.elems._8_8_;
    local_88.values.super_array<unsigned_int,_8UL>.elems[4] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[4];
    local_88.values.super_array<unsigned_int,_8UL>.elems[5] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[5];
    uVar11 = local_88.values.super_array<unsigned_int,_8UL>.elems._16_8_;
    local_88.values.super_array<unsigned_int,_8UL>.elems[6] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[6];
    local_88.values.super_array<unsigned_int,_8UL>.elems[7] =
         local_a8.values.super_array<unsigned_int,_8UL>.elems[7];
    uVar13 = local_88.values.super_array<unsigned_int,_8UL>.elems._24_8_;
    local_88.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar6;
    local_88.values.super_array<unsigned_int,_8UL>.elems[1] = SUB84(uVar6,4);
    local_a8.values.super_array<unsigned_int,_8UL>.elems[0] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[0];
    local_a8.values.super_array<unsigned_int,_8UL>.elems[1] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[1];
    local_88.values.super_array<unsigned_int,_8UL>.elems[2] = (value_type_conflict)uVar7;
    local_88.values.super_array<unsigned_int,_8UL>.elems[3] = SUB84(uVar7,4);
    local_a8.values.super_array<unsigned_int,_8UL>.elems[2] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[2];
    local_a8.values.super_array<unsigned_int,_8UL>.elems[3] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[3];
    local_88.values.super_array<unsigned_int,_8UL>.elems[4] = (value_type_conflict)uVar10;
    local_88.values.super_array<unsigned_int,_8UL>.elems[5] = SUB84(uVar10,4);
    local_a8.values.super_array<unsigned_int,_8UL>.elems[4] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[4];
    local_a8.values.super_array<unsigned_int,_8UL>.elems[5] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[5];
    local_88.values.super_array<unsigned_int,_8UL>.elems[6] = (value_type_conflict)uVar12;
    local_88.values.super_array<unsigned_int,_8UL>.elems[7] = SUB84(uVar12,4);
    local_a8.values.super_array<unsigned_int,_8UL>.elems[6] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[6];
    local_a8.values.super_array<unsigned_int,_8UL>.elems[7] =
         local_88.values.super_array<unsigned_int,_8UL>.elems[7];
    local_88.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar8;
    local_88.values.super_array<unsigned_int,_8UL>.elems._8_8_ = uVar9;
    local_88.values.super_array<unsigned_int,_8UL>.elems._16_8_ = uVar11;
    local_88.values.super_array<unsigned_int,_8UL>.elems._24_8_ = uVar13;
  }
  lVar17 = 0x1c;
  do {
    bVar22 = 0;
    if (lVar17 == -4) break;
    uVar16 = *(uint *)((long)local_88.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    uVar3 = *(uint *)((long)local_a8.values.super_array<unsigned_int,_8UL>.elems + lVar17);
    bVar22 = -(uVar16 <= uVar3) | 1;
    lVar17 = lVar17 + -4;
  } while (uVar16 == uVar3);
  if (bVar22 == 0) goto LAB_0013625b;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[0] = 0xffffffff;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[1] = 0xffffffff;
  eVar14 = operator<=(&local_a8,(unsigned_long *)&local_c8);
  if (!eVar14) {
    lVar17 = 0;
    uVar16 = 0;
    do {
      uVar19 = ((ulong)local_a8.values.super_array<unsigned_int,_8UL>.elems[lVar17] - (ulong)uVar16)
               - (ulong)local_88.values.super_array<unsigned_int,_8UL>.elems[lVar17];
      local_a8.values.super_array<unsigned_int,_8UL>.elems[lVar17] = (value_type_conflict)uVar19;
      uVar16 = (uint)(uVar19 >> 0x20 != 0);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    uVar15 = lsb<256u,unsigned_int,void,false>(&local_a8);
    pvVar18 = (value_type_conflict *)&local_88;
    pvVar21 = local_68;
    if (uVar15 != 0) {
      if ((uVar15 & 0xffffff00) == 0) {
        uintwide_t<256U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_a8,uVar15);
      }
      else {
        local_a8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
        local_a8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
        local_a8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
        local_a8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
        local_a8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
        local_a8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
        local_a8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
        local_a8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
      }
    }
    goto LAB_001360cf;
  }
  uVar19 = detail::gcd_unsafe<unsigned_long>
                     (local_a8.values.super_array<unsigned_int,_8UL>.elems._0_8_,
                      local_88.values.super_array<unsigned_int,_8UL>.elems._0_8_);
  local_c8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
  local_c8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
  if (uVar19 == 0) {
    lVar17 = 0;
  }
  else {
    lVar20 = 0;
    do {
      *(int *)((long)local_c8.values.super_array<unsigned_int,_8UL>.elems + lVar20) = (int)uVar19;
      lVar17 = lVar20 + 4;
      uVar19 = uVar19 >> 0x20;
      if (uVar19 == 0) break;
      bVar23 = lVar20 != 0x1c;
      lVar20 = lVar17;
    } while (bVar23);
  }
  if (lVar17 != 0x20) {
    memset((void *)((long)local_c8.values.super_array<unsigned_int,_8UL>.elems + lVar17),0,
           0x20 - lVar17);
  }
  local_88.values.super_array<unsigned_int,_8UL>.elems[4] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[4];
  local_88.values.super_array<unsigned_int,_8UL>.elems[5] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[5];
  local_88.values.super_array<unsigned_int,_8UL>.elems[6] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[6];
  local_88.values.super_array<unsigned_int,_8UL>.elems[7] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[7];
  local_88.values.super_array<unsigned_int,_8UL>.elems[0] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[0];
  local_88.values.super_array<unsigned_int,_8UL>.elems[1] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[1];
  local_88.values.super_array<unsigned_int,_8UL>.elems[2] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[2];
  local_88.values.super_array<unsigned_int,_8UL>.elems[3] =
       local_c8.values.super_array<unsigned_int,_8UL>.elems[3];
LAB_0013625b:
  local_c8.values.super_array<unsigned_int,_8UL>.elems[4] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[4];
  local_c8.values.super_array<unsigned_int,_8UL>.elems[5] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[5];
  local_c8.values.super_array<unsigned_int,_8UL>.elems[6] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[6];
  local_c8.values.super_array<unsigned_int,_8UL>.elems[7] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[7];
  local_c8.values.super_array<unsigned_int,_8UL>.elems[0] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[0];
  local_c8.values.super_array<unsigned_int,_8UL>.elems[1] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[1];
  local_c8.values.super_array<unsigned_int,_8UL>.elems[2] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[2];
  local_c8.values.super_array<unsigned_int,_8UL>.elems[3] =
       local_88.values.super_array<unsigned_int,_8UL>.elems[3];
  if (local_60 != 0) {
    if ((local_60 & 0xffffff00) == 0) {
      uintwide_t<256U,_unsigned_int,_void,_false>::shl<unsigned_long>(&local_c8,local_60);
    }
    else {
      local_c8.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
      local_c8.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
      local_c8.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
      local_c8.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
      local_c8.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
      local_c8.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
      local_c8.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
      local_c8.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
    }
  }
  goto LAB_0013629f;
}

Assistant:

constexpr auto gcd(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& a, // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
                     const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // This implementation of GCD is an adaptation
    // of existing code from Boost.Multiprecision.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_ushort_type       = typename local_wide_integer_type::limb_type;
    using local_ularge_type       = typename local_wide_integer_type::double_limb_type;

    const auto u_is_neg = local_wide_integer_type::is_neg(a);
    const auto v_is_neg = local_wide_integer_type::is_neg(b);

    local_wide_integer_type u((!u_is_neg) ? a : -a);
    local_wide_integer_type v((!v_is_neg) ? b : -b);

    local_wide_integer_type result;

    using local_size_type = typename local_wide_integer_type::representation_type::size_type;

    if(u == v)
    { // NOLINT(bugprone-branch-clone)
      // This handles cases having (u = v) and also (u = v = 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(v) == static_cast<local_ushort_type>(UINT8_C(0))) && (v == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (v = 0) with (u != 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(u) == static_cast<local_ushort_type>(UINT8_C(0))) && (u == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (u = 0) with (v != 0).
      result = std::move(v); // LCOV_EXCL_LINE
    }
    else
    {
      // Now we handle cases having (u != 0) and (v != 0).

      // Let shift := lg K, where K is the greatest
      // power of 2 dividing both u and v.

      const unsigned_fast_type u_shift = lsb(u);
      const unsigned_fast_type v_shift = lsb(v);

      const unsigned_fast_type left_shift_amount = (detail::min_unsafe)(u_shift, v_shift);

      u >>= u_shift;
      v >>= v_shift;

      for(;;)
      {
        // Now u and v are both odd, so diff(u, v) is even.
        // Let u = min(u, v), v = diff(u, v) / 2.

        if(u > v)
        {
          swap(u, v);
        }

        if(u == v)
        {
          break;
        }

        if(v <= (std::numeric_limits<local_ularge_type>::max)())
        {
          const auto my_v_hi =
            static_cast<local_ushort_type>
            (
              (v.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(v.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const auto my_u_hi =
            static_cast<local_ushort_type>
            (
              (u.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(u.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const local_ularge_type v_large = detail::make_large(*v.crepresentation().cbegin(), my_v_hi);
          const local_ularge_type u_large = detail::make_large(*u.crepresentation().cbegin(), my_u_hi);

          u = detail::integer_gcd_reduce(v_large, u_large);

          break;
        }

        v  -= u;
        v >>= lsb(v);
      }

      result = (u << left_shift_amount);
    }
   
    if(u_is_neg != v_is_neg)
    {
      result.negate();
    }

    return result;
  }